

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testInit
          (VaryingLocationAliasingWithMixedInterpolationTest *this)

{
  GLuint GVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Type TVar5;
  undefined1 local_f8 [8];
  testCase test_case_out;
  testCase test_case_in;
  bool is_comb_accepted_as_fs_in;
  bool is_goten_accepted_as_fs_in;
  uint uStack_90;
  bool is_gohan_accepted_as_fs_in;
  bool is_goten_flat;
  bool is_gohan_flat;
  bool is_goten_double;
  bool is_gohan_double;
  GLuint int_goten;
  GLuint int_gohan;
  GLuint goten;
  GLuint gohan;
  GLuint stage;
  GLuint n_req_components_goten;
  GLuint n_req_components_gohan;
  GLuint GStack_6c;
  bool is_float_type_goten;
  GLuint local_68;
  Type local_5c;
  Type *local_50;
  Type *type_goten;
  GLuint j;
  GLuint GStack_3c;
  bool is_float_type_gohan;
  GLuint local_38;
  Type local_2c;
  Type *local_20;
  Type *type_gohan;
  GLuint i;
  GLuint n_types;
  VaryingLocationAliasingWithMixedInterpolationTest *this_local;
  
  _i = this;
  type_gohan._4_4_ = TestBase::getTypesNumber((TestBase *)this);
  for (type_gohan._0_4_ = 0; (uint)type_gohan < type_gohan._4_4_;
      type_gohan._0_4_ = (uint)type_gohan + 1) {
    TVar5 = TestBase::getType((TestBase *)this,(uint)type_gohan);
    _j = TVar5._0_8_;
    local_2c.m_basic_type = j;
    local_2c.m_n_columns = GStack_3c;
    local_38 = TVar5.m_n_rows;
    local_2c.m_n_rows = local_38;
    local_20 = &local_2c;
    _j = TVar5;
    type_goten._7_1_ = isFloatType(this,local_20);
    if (local_20->m_n_columns == 1) {
      for (type_goten._0_4_ = 0; (uint)type_goten < type_gohan._4_4_;
          type_goten._0_4_ = (uint)type_goten + 1) {
        TVar5 = TestBase::getType((TestBase *)this,(uint)type_goten);
        _n_req_components_gohan = TVar5._0_8_;
        local_5c.m_basic_type = n_req_components_gohan;
        local_5c.m_n_columns = GStack_6c;
        local_68 = TVar5.m_n_rows;
        local_5c.m_n_rows = local_68;
        local_50 = &local_5c;
        bVar3 = isFloatType(this,local_50);
        if (((local_50->m_n_columns == 1) && ((bool)(type_goten._7_1_ & 1) == bVar3)) &&
           (GVar1 = local_20->m_n_rows, GVar1 + local_50->m_n_rows < 5)) {
          for (goten = 0; goten < 6; goten = goten + 1) {
            if (goten != 0) {
              for (_is_goten_flat = 0; _is_goten_flat < 3; _is_goten_flat = _is_goten_flat + 1) {
                for (uStack_90 = 0; uStack_90 < 3; uStack_90 = uStack_90 + 1) {
                  bVar3 = local_20->m_basic_type != Double;
                  bVar4 = local_50->m_basic_type != Double;
                  if ((bVar3) || (bVar2 = true, _is_goten_flat != 1)) {
                    bVar2 = bVar3;
                  }
                  if ((bVar4) || (bVar3 = true, uStack_90 != 1)) {
                    bVar3 = bVar4;
                  }
                  bVar4 = false;
                  if (bVar2) {
                    bVar4 = bVar3;
                  }
                  if (_is_goten_flat != uStack_90) {
                    test_case_out.m_type_goten.m_n_columns = 0;
                    local_f8._0_4_ = 0;
                    test_case_out.m_component_gohan = _is_goten_flat;
                    test_case_out.m_component_goten = uStack_90;
                    test_case_out.m_interpolation_gohan._0_1_ = SMOOTH;
                    test_case_out.m_interpolation_goten = goten;
                    test_case_out._16_8_ = *(undefined8 *)local_20;
                    test_case_out.m_type_gohan.m_basic_type = local_20->m_n_rows;
                    test_case_out.m_type_gohan.m_n_columns = local_50->m_basic_type;
                    test_case_out.m_type_gohan.m_n_rows = local_50->m_n_columns;
                    test_case_out.m_type_goten.m_basic_type = local_50->m_n_rows;
                    local_f8._4_4_ = GVar1;
                    test_case_out.m_type_goten.m_n_rows = GVar1;
                    if ((goten != 1) && ((goten != 5 || (bVar4)))) {
                      std::
                      vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
                      ::push_back(&this->m_test_cases,
                                  (value_type *)&test_case_out.m_type_goten.m_n_columns);
                    }
                    if (goten != 5) {
                      std::
                      vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
                      ::push_back(&this->m_test_cases,(value_type *)local_f8);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void VaryingLocationAliasingWithMixedInterpolationTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type_gohan		   = getType(i);
		const bool		   is_float_type_gohan = isFloatType(type_gohan);

		/* Skip matrices */
		if (1 != type_gohan.m_n_columns)
		{
			continue;
		}

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& type_goten		   = getType(j);
			const bool		   is_float_type_goten = isFloatType(type_goten);

			/* Skip matrices */
			if (1 != type_goten.m_n_columns)
			{
				continue;
			}

			/* Skip invalid combinations */
			if (is_float_type_gohan != is_float_type_goten)
			{
				continue;
			}

			const GLuint n_req_components_gohan = type_gohan.m_n_rows;
			const GLuint n_req_components_goten = type_goten.m_n_rows;

			/* Skip pairs that cannot fit into one location */
			if (n_components_per_location < (n_req_components_gohan + n_req_components_goten))
			{
				continue;
			}

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				/* Skip compute shader */
				if (Utils::Shader::COMPUTE == stage)
				{
					continue;
				}

				const GLuint gohan = 0;
				const GLuint goten = gohan + n_req_components_gohan;

				for (GLuint int_gohan = 0; int_gohan < INTERPOLATION_MAX; ++int_gohan)
				{
					for (GLuint int_goten = 0; int_goten < INTERPOLATION_MAX; ++int_goten)
					{
						const bool is_gohan_double = (Utils::Type::Double == type_gohan.m_basic_type) ? true : false;
						const bool is_goten_double = (Utils::Type::Double == type_goten.m_basic_type) ? true : false;
						const bool is_gohan_flat   = (FLAT == int_gohan) ? true : false;
						const bool is_goten_flat   = (FLAT == int_goten) ? true : false;
						const bool is_gohan_accepted_as_fs_in =
							(is_gohan_double && is_gohan_flat) || (!is_gohan_double);
						const bool is_goten_accepted_as_fs_in =
							(is_goten_double && is_goten_flat) || (!is_goten_double);
						const bool is_comb_accepted_as_fs_in = is_gohan_accepted_as_fs_in && is_goten_accepted_as_fs_in;

						/* Skip when both are the same */
						if (int_gohan == int_goten)
						{
							continue;
						}

						testCase test_case_in = { gohan,
												  goten,
												  (INTERPOLATIONS)int_gohan,
												  (INTERPOLATIONS)int_goten,
												  true,
												  (Utils::Shader::STAGES)stage,
												  type_gohan,
												  type_goten };

						testCase test_case_out = { gohan,
												   goten,
												   (INTERPOLATIONS)int_gohan,
												   (INTERPOLATIONS)int_goten,
												   false,
												   (Utils::Shader::STAGES)stage,
												   type_gohan,
												   type_goten };

						/* Skip inputs in:
						 * vertex shader,
						 * fragment shader when not flat double is used
						 */
						if ((Utils::Shader::VERTEX != stage) &&
							((Utils::Shader::FRAGMENT != stage) || (true == is_comb_accepted_as_fs_in)))
						{
							m_test_cases.push_back(test_case_in);
						}

						/* Skip outputs in fragment shader */
						if (Utils::Shader::FRAGMENT != stage)
						{
							m_test_cases.push_back(test_case_out);
						}
					}
				}
			}
		}
	}
}